

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.cpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanSyncObjectManager::CreateSemaphores
          (VulkanSyncObjectManager *this,VulkanRecycledSemaphore *pSemaphores,uint32_t Count)

{
  pointer *pppVVar1;
  ulong uVar2;
  VulkanRecycledSemaphore *this_00;
  ulong uVar3;
  ulong uVar4;
  RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *this_01;
  VkSemaphore vkSem;
  VkSemaphoreCreateInfo SemCI;
  VkSemaphore local_90;
  __shared_ptr<VulkanUtilities::VulkanSyncObjectManager,(__gnu_cxx::_Lock_policy)2> local_88 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<VulkanUtilities::VulkanSyncObjectManager,(__gnu_cxx::_Lock_policy)2> local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  VkSemaphoreCreateInfo local_68;
  RecycledSyncObject<VulkanUtilities::VkSemaphoreType> local_50;
  
  std::mutex::lock(&this->m_SemaphorePoolGuard);
  uVar2 = (ulong)Count;
  uVar3 = 0;
  this_00 = pSemaphores;
  while ((uVar4 = uVar2, uVar2 != uVar3 &&
         (uVar4 = uVar3,
         (this->m_SemaphorePool).
         super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
         super__Vector_impl_data._M_start !=
         (this->m_SemaphorePool).
         super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
         super__Vector_impl_data._M_finish))) {
    std::__shared_ptr<VulkanUtilities::VulkanSyncObjectManager,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<VulkanUtilities::VulkanSyncObjectManager,void>
              (local_78,(__weak_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>
                         *)this);
    RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::RecycledSyncObject
              (&local_50,(shared_ptr<VulkanUtilities::VulkanSyncObjectManager> *)local_78,
               (this->m_SemaphorePool).
               super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
               super__Vector_impl_data._M_finish[-1]);
    RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::operator=(this_00,&local_50);
    RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::~RecycledSyncObject(&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
    pppVVar1 = &(this->m_SemaphorePool).
                super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppVVar1 = *pppVVar1 + -1;
    uVar3 = uVar3 + 1;
    this_00 = this_00 + 1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_SemaphorePoolGuard);
  local_68.pNext = (void *)0x0;
  local_68.flags = 0;
  local_68._20_4_ = 0;
  local_68.sType = VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO;
  local_68._4_4_ = 0;
  this_01 = pSemaphores + uVar4;
  for (; uVar4 < uVar2; uVar4 = uVar4 + 1) {
    local_90 = (NativeType)0x0;
    (*vkCreateSemaphore)
              (this->m_LogicalDevice->m_VkDevice,&local_68,(VkAllocationCallbacks *)0x0,&local_90);
    std::__shared_ptr<VulkanUtilities::VulkanSyncObjectManager,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<VulkanUtilities::VulkanSyncObjectManager,void>
              (local_88,(__weak_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>
                         *)this);
    RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::RecycledSyncObject
              (&local_50,(shared_ptr<VulkanUtilities::VulkanSyncObjectManager> *)local_88,local_90);
    RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::operator=(this_01,&local_50);
    RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::~RecycledSyncObject(&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
    this_01 = this_01 + 1;
  }
  return;
}

Assistant:

void VulkanSyncObjectManager::CreateSemaphores(VulkanRecycledSemaphore* pSemaphores, uint32_t Count)
{
    uint32_t SemIdx = 0;
    {
        std::lock_guard<std::mutex> Lock{m_SemaphorePoolGuard};
        for (; SemIdx < Count && !m_SemaphorePool.empty(); ++SemIdx)
        {
            pSemaphores[SemIdx] = VulkanRecycledSemaphore{shared_from_this(), m_SemaphorePool.back()};
            m_SemaphorePool.pop_back();
        }
    }

    // Create new semaphores.
    VkSemaphoreCreateInfo SemCI{};
    SemCI.sType = VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO;

    for (; SemIdx < Count; ++SemIdx)
    {
        VkSemaphore vkSem = VK_NULL_HANDLE;
        vkCreateSemaphore(m_LogicalDevice.GetVkDevice(), &SemCI, nullptr, &vkSem);
        pSemaphores[SemIdx] = VulkanRecycledSemaphore{shared_from_this(), vkSem};
    }
}